

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string
          (xpath_string *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack)

{
  uint uVar1;
  xpath_stack xVar2;
  xpath_memory_block *pxVar3;
  uint uVar4;
  undefined8 s;
  bool bVar5;
  xpath_value_type xVar6;
  int iVar7;
  char *pcVar8;
  xpath_ast_node *pxVar9;
  double *pdVar10;
  xpath_string *pxVar11;
  xpath_allocator *end;
  undefined7 extraout_var;
  xml_attribute_struct *pxVar12;
  char_t *pcVar13;
  char *pcVar14;
  byte *pbVar15;
  size_t sVar16;
  byte bVar17;
  xpath_string *pxVar18;
  undefined1 *puVar19;
  xml_attribute xVar20;
  ulong uVar21;
  char *pcVar22;
  byte *pbVar23;
  byte *pbVar24;
  byte *pbVar25;
  xpath_allocator *pxVar26;
  double *pdVar27;
  xpath_allocator *pxVar28;
  byte *pbVar29;
  long lVar30;
  xpath_memory_block *pxVar31;
  char_t *begin;
  char cVar32;
  undefined1 s_00 [8];
  undefined1 *puVar33;
  long lVar34;
  xml_node xVar35;
  long lVar36;
  size_t size;
  double dVar37;
  xml_node_struct *pxVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  xpath_node xVar41;
  double v;
  xpath_string *local_c8;
  xpath_string *local_c0;
  undefined1 local_b8 [8];
  xml_attribute xStack_b0;
  xml_attribute_struct *local_a8;
  xpath_string *local_90;
  xpath_allocator *local_88;
  undefined1 local_80 [16];
  ulong local_70;
  undefined1 local_68 [16];
  size_t local_58;
  double *local_48;
  xpath_stack local_40;
  
LAB_003691aa:
  switch(this->_type) {
  case '\x12':
    pcVar14 = (char *)(this->_data).string;
LAB_003697d3:
    __return_storage_ptr__->_buffer = pcVar14;
LAB_003697d7:
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    return (xpath_string *)pcVar14;
  default:
    xVar6 = (xpath_value_type)(byte)this->_rettype;
    goto LAB_003698ee;
  case '\x14':
    xVar6 = (xpath_value_type)this->_rettype;
    if (((this->_data).variable)->_type != xVar6) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2b11,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == '\x03') {
      pcVar14 = *(char **)((this->_data).variable + 1);
      pxVar18 = (xpath_string *)0x3fd4cd;
      if ((xpath_string *)pcVar14 != (xpath_string *)0x0) {
        pxVar18 = (xpath_string *)pcVar14;
      }
      goto LAB_003695d7;
    }
LAB_003698ee:
    if ((char)xVar6 != '\x01') {
      if ((xVar6 & 0xff) != xpath_type_number) {
        if ((xVar6 & 0xff) != xpath_type_boolean) {
          __assert_fail("false && \"Wrong expression for return type string\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x2b32,
                        "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                       );
        }
        bVar5 = eval_boolean(this,c,stack);
        pcVar14 = (char *)CONCAT71(extraout_var,bVar5);
        pcVar22 = "false";
        if (bVar5) {
          pcVar22 = "true";
        }
        __return_storage_ptr__->_buffer = pcVar22;
        goto LAB_003697d7;
      }
      pxVar38 = (xml_node_struct *)eval_number(this,c,stack);
      pxVar28 = stack->result;
      if (((double)pxVar38 == 0.0) && (!NAN((double)pxVar38))) {
        pcVar14 = (char *)(xpath_string *)0x414675;
        goto LAB_003697d3;
      }
      if (NAN((double)pxVar38)) {
        pcVar14 = "NaN";
        goto LAB_003697d3;
      }
      if (((double)pxVar38 + (double)pxVar38 == (double)pxVar38) &&
         (!NAN((double)pxVar38 + (double)pxVar38) && !NAN((double)pxVar38))) {
        pcVar14 = "-Infinity";
        if (0.0 < (double)pxVar38) {
          pcVar14 = "Infinity";
        }
        goto LAB_003697d3;
      }
      local_b8 = (undefined1  [8])pxVar38;
      snprintf(local_b8,0x20,"%.*e",0xf);
      pbVar15 = (byte *)strchr(local_b8,0x65);
      if (pbVar15 == (byte *)0x0) {
        __assert_fail("exponent_string",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2107,
                      "void pugi::impl::(anonymous namespace)::convert_number_to_mantissa_exponent(double, char (&)[32], char **, int *)"
                     );
      }
      iVar7 = atoi((char *)(pbVar15 + 1));
      uVar21 = (ulong)(local_b8[0] == 0x2d);
      if ((local_b8[uVar21] == 0x30) || ((local_b8[uVar21 + 1] | 2) != 0x2e)) {
        __assert_fail("mantissa[0] != \'0\' && (mantissa[1] == \'.\' || mantissa[1] == \',\')",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x210d,
                      "void pugi::impl::(anonymous namespace)::convert_number_to_mantissa_exponent(double, char (&)[32], char **, int *)"
                     );
      }
      pbVar29 = local_b8 + uVar21 + 1;
      *pbVar29 = local_b8[uVar21];
      goto LAB_0036a07f;
    }
    xVar35._root = (xml_node_struct *)stack->temp;
    pxVar31 = (xpath_memory_block *)(xVar35._root)->header;
    local_c8 = (xpath_string *)(xVar35._root)->name;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = xVar35._root;
    eval_node_set((xpath_node_set_raw *)local_b8,this,c,(xpath_stack *)local_68,nodeset_eval_first);
    if (xStack_b0._attr == local_a8) {
      __return_storage_ptr__->_buffer = "";
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
    }
    else {
      xVar41 = xpath_first((xpath_node *)xStack_b0._attr,(xpath_node *)local_a8,local_b8._0_4_);
      string_value(__return_storage_ptr__,(anon_unknown_0 *)xVar41._node._root._root,
                   (xpath_node *)xVar41._attribute._attr._attr,stack->result);
    }
    pxVar3 = (xpath_memory_block *)(xVar35._root)->header;
    while (pxVar3 != pxVar31) {
      pxVar3 = pxVar3->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    break;
  case '\x19':
    pxVar38 = (xml_node_struct *)(c->n)._attribute._attr;
    if ((pxVar38 == (xml_node_struct *)0x0) &&
       (pxVar38 = (c->n)._node._root, pxVar38 == (xml_node_struct *)0x0)) {
      pxVar11 = (xpath_string *)0x3fd4cd;
    }
    else {
      pxVar11 = (xpath_string *)0x3fd4cd;
      if ((xpath_string *)pxVar38->name != (xpath_string *)0x0) {
        pxVar11 = (xpath_string *)pxVar38->name;
      }
    }
    pcVar14 = strchr((char *)pxVar11,0x3a);
    pxVar18 = (xpath_string *)((long)&((xpath_string *)pcVar14)->_buffer + 1);
    if ((xpath_string *)pcVar14 == (xpath_string *)0x0) {
      pxVar18 = pxVar11;
    }
LAB_003695d7:
    __return_storage_ptr__->_buffer = (char_t *)pxVar18;
    goto LAB_003697d7;
  case '\x1a':
    xVar35._root = (xml_node_struct *)stack->result;
    pxVar31 = (xpath_memory_block *)(xVar35._root)->header;
    local_c8 = (xpath_string *)(xVar35._root)->name;
    eval_node_set((xpath_node_set_raw *)local_b8,this->_left,c,stack,nodeset_eval_first);
    xVar41 = xpath_first((xpath_node *)xStack_b0._attr,(xpath_node *)local_a8,local_b8._0_4_);
    xVar20._attr = xVar41._attribute._attr._attr;
    if ((xVar41._attribute._attr._attr == (xml_attribute_struct *)0x0) &&
       (xVar20._attr = (xml_attribute_struct *)xVar41._node._root._root,
       xVar41._node._root._root == (xml_node_struct *)0x0)) {
      pcVar14 = "";
    }
    else {
      pcVar14 = "";
      if (((xml_node_struct *)xVar20._attr)->name != (char *)0x0) {
        pcVar14 = ((xml_node_struct *)xVar20._attr)->name;
      }
    }
    pcVar8 = strchr(pcVar14,0x3a);
    pcVar22 = pcVar8 + 1;
    if (pcVar8 == (char *)0x0) {
      pcVar22 = pcVar14;
    }
    __return_storage_ptr__->_buffer = pcVar22;
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    pxVar3 = (xpath_memory_block *)(xVar35._root)->header;
    while (pxVar3 != pxVar31) {
      pxVar3 = pxVar3->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    break;
  case '\x1b':
    local_b8 = (undefined1  [8])(c->n)._node._root;
    xStack_b0._attr = (c->n)._attribute._attr;
    pcVar14 = namespace_uri((xpath_node *)local_b8);
    goto LAB_003697d3;
  case '\x1c':
    xVar35._root = (xml_node_struct *)stack->result;
    pxVar31 = (xpath_memory_block *)(xVar35._root)->header;
    local_c8 = (xpath_string *)(xVar35._root)->name;
    eval_node_set((xpath_node_set_raw *)local_b8,this->_left,c,stack,nodeset_eval_first);
    local_68 = (undefined1  [16])
               xpath_first((xpath_node *)xStack_b0._attr,(xpath_node *)local_a8,local_b8._0_4_);
    pcVar13 = namespace_uri((xpath_node *)local_68);
    __return_storage_ptr__->_buffer = pcVar13;
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    pxVar3 = (xpath_memory_block *)(xVar35._root)->header;
    while (pxVar3 != pxVar31) {
      pxVar3 = pxVar3->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    break;
  case '\x1d':
    pxVar38 = (xml_node_struct *)(c->n)._attribute._attr;
    if ((pxVar38 == (xml_node_struct *)0x0) &&
       (pxVar38 = (c->n)._node._root, pxVar38 == (xml_node_struct *)0x0)) goto LAB_003697cc;
    pcVar14 = (char *)(xpath_string *)0x3fd4cd;
    if ((xpath_string *)pxVar38->name != (xpath_string *)0x0) {
      pcVar14 = (char *)pxVar38->name;
    }
    goto LAB_003697d3;
  case '\x1e':
    xVar35._root = (xml_node_struct *)stack->result;
    pxVar31 = (xpath_memory_block *)(xVar35._root)->header;
    local_c8 = (xpath_string *)(xVar35._root)->name;
    eval_node_set((xpath_node_set_raw *)local_b8,this->_left,c,stack,nodeset_eval_first);
    xVar41 = xpath_first((xpath_node *)xStack_b0._attr,(xpath_node *)local_a8,local_b8._0_4_);
    xVar20._attr = xVar41._attribute._attr._attr;
    if ((xVar41._attribute._attr._attr == (xml_attribute_struct *)0x0) &&
       (xVar20._attr = (xml_attribute_struct *)xVar41._node._root._root,
       xVar41._node._root._root == (xml_node_struct *)0x0)) {
      pcVar14 = "";
    }
    else {
      pcVar14 = "";
      if (((xml_node_struct *)xVar20._attr)->name != (char *)0x0) {
        pcVar14 = ((xml_node_struct *)xVar20._attr)->name;
      }
    }
    __return_storage_ptr__->_buffer = pcVar14;
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    pxVar3 = (xpath_memory_block *)(xVar35._root)->header;
    while (pxVar3 != pxVar31) {
      pxVar3 = pxVar3->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    break;
  case '\x1f':
    pxVar11 = string_value(__return_storage_ptr__,(anon_unknown_0 *)(c->n)._node._root,
                           (xpath_node *)(c->n)._attribute._attr,stack->result);
    return pxVar11;
  case ' ':
    goto switchD_003691c2_caseD_20;
  case '!':
    pxVar28 = stack->temp;
    lVar34 = 1;
    for (pxVar9 = this->_right; pxVar9 != (xpath_ast_node *)0x0; pxVar9 = pxVar9->_next) {
      lVar34 = lVar34 + 1;
    }
    pxVar31 = pxVar28->_root;
    local_90 = (xpath_string *)pxVar28->_root_size;
    pdVar10 = (double *)xpath_allocator::allocate(pxVar28,lVar34 * 0x18);
    if (pdVar10 == (double *)0x0) {
      pxVar11 = (xpath_string *)0x3fd4cd;
      __return_storage_ptr__->_buffer = "";
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
      pxVar18 = local_90;
      goto LAB_00369ec3;
    }
    xVar2 = *stack;
    local_68._0_8_ = xVar2.temp;
    local_68._8_4_ = (int)xVar2.result;
    local_68._12_4_ = xVar2.result._4_4_;
    local_88 = pxVar28;
    eval_string((xpath_string *)local_b8,this->_left,c,(xpath_stack *)local_68);
    pdVar10[2] = (double)local_a8;
    *pdVar10 = (double)local_b8;
    pdVar10[1] = (double)xStack_b0._attr;
    pxVar9 = this->_right;
    local_48 = pdVar10;
    if (pxVar9 == (xpath_ast_node *)0x0) {
      lVar30 = 1;
    }
    else {
      lVar30 = 1;
      do {
        eval_string((xpath_string *)local_b8,pxVar9,c,(xpath_stack *)local_68);
        pdVar10[5] = (double)local_a8;
        pdVar10[3] = (double)local_b8;
        pdVar10[4] = (double)xStack_b0._attr;
        lVar30 = lVar30 + 1;
        pxVar9 = pxVar9->_next;
        pdVar10 = pdVar10 + 3;
      } while (pxVar9 != (xpath_ast_node *)0x0);
    }
    pdVar10 = local_48;
    if (lVar30 != lVar34) {
      __assert_fail("pos == count",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2a2f,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string_concat(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (lVar34 == 0) {
      pcVar13 = (char_t *)xpath_allocator::allocate(stack->result,1);
      pcVar14 = pcVar13;
      if (pcVar13 == (char_t *)0x0) goto LAB_00369eab;
    }
    else {
      pdVar27 = local_48 + 2;
      lVar36 = 0;
      lVar30 = lVar34;
      do {
        if (*(char *)(pdVar27 + -1) == '\x01') {
          dVar37 = *pdVar27;
        }
        else {
          dVar37 = (double)strlength((char_t *)pdVar27[-2]);
        }
        lVar36 = lVar36 + (long)dVar37;
        pdVar27 = pdVar27 + 3;
        lVar30 = lVar30 + -1;
      } while (lVar30 != 0);
      pcVar13 = (char_t *)xpath_allocator::allocate(stack->result,lVar36 + 1);
      if (pcVar13 == (char *)0x0) {
LAB_00369eab:
        pxVar11 = (xpath_string *)0x3fd4cd;
        __return_storage_ptr__->_buffer = "";
        __return_storage_ptr__->_uses_heap = false;
        __return_storage_ptr__->_length_heap = 0;
        pxVar28 = local_88;
        pxVar18 = local_90;
        goto LAB_00369ec3;
      }
      lVar30 = 0;
      pcVar14 = pcVar13;
      do {
        pcVar22 = (char *)pdVar10[lVar30 * 3];
        cVar32 = *pcVar22;
        while (cVar32 != '\0') {
          pcVar22 = pcVar22 + 1;
          *pcVar14 = cVar32;
          pcVar14 = pcVar14 + 1;
          cVar32 = *pcVar22;
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 != lVar34);
    }
    pxVar28 = local_88;
    pxVar18 = local_90;
    *pcVar14 = '\0';
    pxVar11 = xpath_string::from_heap_preallocated(__return_storage_ptr__,pcVar13,pcVar14);
LAB_00369ec3:
    pxVar3 = pxVar28->_root;
    while (pxVar3 != pxVar31) {
      pxVar3 = pxVar3->next;
      pxVar11 = (xpath_string *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          deallocate)();
    }
    pxVar28->_root = pxVar31;
    pxVar28->_root_size = (size_t)pxVar18;
    return pxVar11;
  case '$':
    xVar35._root = (xml_node_struct *)stack->temp;
    pxVar31 = (xpath_memory_block *)(xVar35._root)->header;
    local_c0 = (xpath_string *)(xVar35._root)->name;
    local_80._8_8_ = stack->result;
    local_80._0_8_ = xVar35._root;
    eval_string((xpath_string *)local_b8,this->_left,c,(xpath_stack *)local_80);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)local_80);
    pcVar14 = strstr((char *)local_b8,(char *)local_68._0_8_);
    if (pcVar14 == (char *)0x0) {
      __return_storage_ptr__->_buffer = "";
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
    }
    else {
      xpath_string::from_heap(__return_storage_ptr__,(char_t *)local_b8,pcVar14,stack->result);
    }
    pxVar3 = (xpath_memory_block *)(xVar35._root)->header;
    while (pxVar3 != pxVar31) {
      pxVar3 = pxVar3->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    goto LAB_00369c38;
  case '%':
    xVar35._root = (xml_node_struct *)stack->temp;
    pxVar31 = (xpath_memory_block *)(xVar35._root)->header;
    local_c8 = (xpath_string *)(xVar35._root)->name;
    local_80._8_8_ = stack->result;
    local_80._0_8_ = xVar35._root;
    eval_string((xpath_string *)local_b8,this->_left,c,(xpath_stack *)local_80);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)local_80);
    s_00 = local_b8;
    s = local_68._0_8_;
    pcVar14 = strstr((char *)local_b8,(char *)local_68._0_8_);
    if (pcVar14 == (char *)0x0) {
      __return_storage_ptr__->_buffer = "";
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
    }
    else {
      if (local_68[8] != true) {
        local_58 = strlength((char_t *)s);
        s_00 = local_b8;
      }
      if ((bool)(byte)xStack_b0._attr != true) {
        local_a8 = (xml_attribute_struct *)strlength((char_t *)s_00);
      }
      if (((byte)xStack_b0._attr & 1) == 0) {
        __return_storage_ptr__->_buffer = pcVar14 + local_58;
        __return_storage_ptr__->_uses_heap = false;
        __return_storage_ptr__->_length_heap = 0;
      }
      else {
        xpath_string::from_heap
                  (__return_storage_ptr__,pcVar14 + local_58,
                   (char_t *)
                   ((long)&((xml_node *)&local_a8->header)->_root +
                   (long)&((xml_node_struct *)s_00)->header),stack->result);
      }
    }
    pxVar3 = (xpath_memory_block *)(xVar35._root)->header;
    while (pxVar3 != pxVar31) {
      pxVar3 = pxVar3->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    (xVar35._root)->header = (uintptr_t)pxVar31;
    goto LAB_00369f45;
  case '&':
    xVar35._root = (xml_node_struct *)stack->temp;
    pxVar31 = (xpath_memory_block *)(xVar35._root)->header;
    pcVar13 = (xVar35._root)->name;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = xVar35._root;
    eval_string((xpath_string *)local_b8,this->_left,c,(xpath_stack *)local_68);
    pxVar12 = local_a8;
    if ((bool)(byte)xStack_b0._attr != true) {
      pxVar12 = (xml_attribute_struct *)strlength((char_t *)local_b8);
    }
    dVar37 = eval_number(this->_right,c,stack);
    local_80._0_8_ = floor(dVar37 + 0.5);
    puVar33 = (undefined1 *)((long)&((xml_node *)&pxVar12->header)->_root + 1);
    auVar39._8_4_ = (int)((ulong)puVar33 >> 0x20);
    auVar39._0_8_ = puVar33;
    auVar39._12_4_ = 0x45300000;
    if ((auVar39._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)puVar33) - 4503599627370496.0) <= (double)local_80._0_8_)
    {
      pxVar11 = (xpath_string *)0x3fd4cd;
      __return_storage_ptr__->_buffer = "";
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
    }
    else {
      pxVar28 = (xpath_allocator *)0x3ff0000000000000;
      if (1.0 <= (double)local_80._0_8_) {
        pxVar28 = (xpath_allocator *)local_80._0_8_;
      }
      uVar21 = (long)((double)pxVar28 - 9.223372036854776e+18) & (long)(double)pxVar28 >> 0x3f |
               (long)(double)pxVar28;
      if (puVar33 <= (undefined1 *)(uVar21 - 1)) {
        __assert_fail("1 <= pos && pos <= s_length + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2ab6,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      if ((bool)(byte)xStack_b0._attr != true) {
        local_a8 = (xml_attribute_struct *)strlength((char_t *)local_b8);
      }
      begin = (char_t *)((long)local_b8 + (uVar21 - 1));
      if (((byte)xStack_b0._attr & 1) == 0) {
        __return_storage_ptr__->_buffer = begin;
        __return_storage_ptr__->_uses_heap = false;
        __return_storage_ptr__->_length_heap = 0;
        pxVar11 = __return_storage_ptr__;
      }
      else {
        pxVar11 = xpath_string::from_heap
                            (__return_storage_ptr__,begin,
                             (char_t *)
                             ((long)&((xml_node *)&local_a8->header)->_root +
                             (long)(uintptr_t *)local_b8),stack->result);
      }
    }
    pxVar3 = (xpath_memory_block *)(xVar35._root)->header;
    while (pxVar3 != pxVar31) {
      pxVar3 = pxVar3->next;
      pxVar11 = (xpath_string *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          deallocate)();
    }
    (xVar35._root)->header = (uintptr_t)pxVar31;
    (xVar35._root)->name = pcVar13;
    return pxVar11;
  case '\'':
    xVar35._root = (xml_node_struct *)stack->temp;
    pxVar31 = (xpath_memory_block *)(xVar35._root)->header;
    local_c0 = (xpath_string *)(xVar35._root)->name;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = xVar35._root;
    eval_string((xpath_string *)local_b8,this->_left,c,(xpath_stack *)local_68);
    pxVar12 = local_a8;
    if ((bool)(byte)xStack_b0._attr != true) {
      pxVar12 = (xml_attribute_struct *)strlength((char_t *)local_b8);
    }
    dVar37 = eval_number(this->_right,c,stack);
    local_90 = (xpath_string *)floor(dVar37 + 0.5);
    dVar37 = eval_number(this->_right->_next,c,stack);
    dVar37 = floor(dVar37 + 0.5);
    local_80._0_8_ = local_90;
    if ((NAN((double)local_90)) ||
       (local_80._0_8_ = dVar37 + (double)local_90, NAN((double)local_80._0_8_))) {
LAB_00369a04:
      __return_storage_ptr__->_buffer = "";
LAB_00369a14:
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
    }
    else {
      puVar33 = (undefined1 *)((long)&((xml_node *)&pxVar12->header)->_root + 1);
      auVar40._8_4_ = (int)((ulong)puVar33 >> 0x20);
      auVar40._0_8_ = puVar33;
      auVar40._12_4_ = 0x45300000;
      dVar37 = (auVar40._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)puVar33) - 4503599627370496.0);
      if ((dVar37 <= (double)local_90) ||
         (((double)local_80._0_8_ <= (double)local_90 || ((double)local_80._0_8_ < 1.0))))
      goto LAB_00369a04;
      pxVar11 = (xpath_string *)(xpath_allocator *)0x3ff0000000000000;
      if (1.0 <= (double)local_90) {
        pxVar11 = local_90;
      }
      uVar21 = (long)((double)pxVar11 - 9.223372036854776e+18) & (long)(double)pxVar11 >> 0x3f |
               (long)(double)pxVar11;
      puVar19 = (undefined1 *)
                ((long)(double)local_80._0_8_ >> 0x3f &
                 (long)((double)local_80._0_8_ - 9.223372036854776e+18) |
                (long)(double)local_80._0_8_);
      if (dVar37 <= (double)local_80._0_8_) {
        puVar19 = puVar33;
      }
      if ((puVar19 <= (undefined1 *)(uVar21 - 1)) || (puVar33 < puVar19)) {
        __assert_fail("1 <= pos && pos <= end && end <= s_length + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2ad2,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      pcVar13 = (char_t *)((long)local_b8 + (uVar21 - 1));
      if ((puVar19 == puVar33) && ((bool)(byte)xStack_b0._attr == false)) {
        __return_storage_ptr__->_buffer = pcVar13;
        goto LAB_00369a14;
      }
      xpath_string::from_heap
                (__return_storage_ptr__,pcVar13,
                 puVar19 + (long)((long)&((xml_node_struct *)((long)local_b8 + -0x40))->
                                         first_attribute + 7),stack->result);
    }
    pxVar3 = (xpath_memory_block *)(xVar35._root)->header;
    while (pxVar3 != pxVar31) {
      pxVar3 = pxVar3->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
LAB_00369c38:
    (xVar35._root)->header = (uintptr_t)pxVar31;
    local_c8 = local_c0;
    goto LAB_00369f45;
  case '*':
    string_value((xpath_string *)local_b8,(anon_unknown_0 *)(c->n)._node._root,
                 (xpath_node *)(c->n)._attribute._attr,stack->result);
    goto LAB_003695f8;
  case '+':
    eval_string((xpath_string *)local_b8,this->_left,c,stack);
LAB_003695f8:
    pbVar15 = (byte *)xpath_string::data((xpath_string *)local_b8,stack->result);
    if (pbVar15 == (byte *)0x0) goto LAB_003697cc;
    pbVar24 = (byte *)normalize_space((char_t *)pbVar15);
    goto LAB_003697c2;
  case ',':
    pxVar28 = stack->temp;
    pxVar31 = pxVar28->_root;
    local_90 = (xpath_string *)pxVar28->_root_size;
    local_40.temp = stack->result;
    local_40.result = pxVar28;
    eval_string((xpath_string *)local_b8,this->_left,c,stack);
    eval_string((xpath_string *)local_68,this->_right,c,&local_40);
    eval_string((xpath_string *)local_80,this->_right->_next,c,&local_40);
    end = (xpath_allocator *)xpath_string::data((xpath_string *)local_b8,stack->result);
    if (end == (xpath_allocator *)0x0) {
      __return_storage_ptr__->_buffer = "";
      __return_storage_ptr__->_uses_heap = false;
      __return_storage_ptr__->_length_heap = 0;
      goto LAB_00369d97;
    }
    if (local_80[8] != true) {
      local_70 = strlength((char_t *)local_80._0_8_);
    }
    cVar32 = *(char *)&end->_root;
    pxVar26 = end;
    local_88 = end;
    if (cVar32 != '\0') goto LAB_00369d4d;
    goto LAB_00369d81;
  case ':':
    eval_string((xpath_string *)local_b8,this->_left,c,stack);
    pbVar15 = (byte *)xpath_string::data((xpath_string *)local_b8,stack->result);
    if (pbVar15 != (byte *)0x0) {
      bVar17 = *pbVar15;
      pbVar24 = pbVar15;
      if (bVar17 != 0) {
        pcVar13 = (this->_data).string;
        pbVar23 = pbVar15;
        pbVar29 = pbVar15;
        do {
          pbVar29 = pbVar29 + 1;
          if ((char)bVar17 < '\0') {
            uVar21 = 1;
          }
          else {
            bVar17 = pcVar13[bVar17];
            uVar21 = (ulong)(-1 < (char)bVar17);
          }
          pbVar24 = pbVar23 + uVar21;
          *pbVar23 = bVar17;
          bVar17 = *pbVar29;
          pbVar23 = pbVar24;
        } while (bVar17 != 0);
      }
      *pbVar24 = 0;
      goto LAB_003697c2;
    }
LAB_003697cc:
    pcVar14 = (char *)(xpath_string *)0x3fd4cd;
    goto LAB_003697d3;
  }
  (xVar35._root)->header = (uintptr_t)pxVar31;
LAB_00369f45:
  (xVar35._root)->name = (char_t *)local_c8;
  return local_c8;
LAB_00369d4d:
  pxVar26 = (xpath_allocator *)((long)&pxVar26->_root + 1);
  pcVar14 = strchr((char *)local_68._0_8_,(int)cVar32);
  if (pcVar14 == (char *)0x0) {
LAB_00369d6f:
    *(char *)&end->_root = cVar32;
    end = (xpath_allocator *)((long)&end->_root + 1);
  }
  else if ((ulong)((long)pcVar14 - local_68._0_8_) < local_70) {
    cVar32 = *(char *)(local_80._0_8_ + ((long)pcVar14 - local_68._0_8_));
    goto LAB_00369d6f;
  }
  cVar32 = *(char *)&pxVar26->_root;
  if (cVar32 == '\0') {
LAB_00369d81:
    *(undefined1 *)&end->_root = 0;
    xpath_string::from_heap_preallocated(__return_storage_ptr__,(char_t *)local_88,(char_t *)end);
LAB_00369d97:
    pxVar3 = pxVar28->_root;
    while (pxVar3 != pxVar31) {
      pxVar3 = pxVar3->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    pxVar28->_root = pxVar31;
    pxVar28->_root_size = (size_t)local_90;
    return local_90;
  }
  goto LAB_00369d4d;
switchD_003691c2_caseD_20:
  this = this->_left;
  goto LAB_003691aa;
  while (pbVar23 = pbVar15 + -1, pbVar24 = pbVar15, pbVar15 = pbVar15 + -1, *pbVar23 == 0x30) {
LAB_0036a07f:
    pbVar24 = pbVar29;
    if (pbVar15 == pbVar29) break;
  }
  uVar1 = iVar7 + 1;
  *pbVar24 = 0;
  sVar16 = strlen(local_b8);
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  size = uVar4 + sVar16 + 4;
  pbVar15 = (byte *)xpath_allocator::allocate(pxVar28,size);
  if (pbVar15 == (byte *)0x0) {
    __return_storage_ptr__->_buffer = "";
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    return (xpath_string *)0x3fd4cd;
  }
  pbVar23 = pbVar15;
  if ((double)pxVar38 < 0.0) {
    pbVar23 = pbVar15 + 1;
    *pbVar15 = 0x2d;
  }
  if (iVar7 < 0) {
    pbVar24 = pbVar23 + 1;
    *pbVar23 = 0x30;
    if (*pbVar29 == 0) goto LAB_0036a28d;
    pbVar23[1] = 0x2e;
    pbVar25 = pbVar23 + 2;
    if (iVar7 != -1) {
      memset(pbVar25,0x30,(ulong)(-iVar7 - 2) + 1);
      pbVar25 = pbVar24 + (ulong)(-iVar7 - 2) + 2;
    }
  }
  else {
    iVar7 = iVar7 + 2;
    do {
      pbVar25 = pbVar23;
      bVar17 = *pbVar29;
      if (9 < (int)(char)bVar17 - 0x30U && bVar17 != 0) {
        __assert_fail("*mantissa == 0 || static_cast<unsigned int>(*mantissa - \'0\') <= 9",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x213e,
                      "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                     );
      }
      bVar5 = bVar17 != 0;
      if (!bVar5) {
        bVar17 = 0x30;
      }
      pbVar29 = pbVar29 + bVar5;
      *pbVar25 = bVar17;
      pbVar24 = pbVar25 + 1;
      iVar7 = iVar7 + -1;
      pbVar23 = pbVar24;
    } while (1 < iVar7);
    if (*pbVar29 == 0) goto LAB_0036a28d;
    *pbVar24 = 0x2e;
    pbVar25 = pbVar25 + 2;
  }
  bVar17 = *pbVar29;
  pbVar24 = pbVar25;
  while (bVar17 != 0) {
    pbVar29 = pbVar29 + 1;
    if (9 < (int)(char)bVar17 - 0x30U) {
      __assert_fail("static_cast<unsigned int>(*mantissa - \'0\') <= 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2154,
                    "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                   );
    }
    *pbVar24 = bVar17;
    pbVar24 = pbVar24 + 1;
    bVar17 = *pbVar29;
  }
LAB_0036a28d:
  if (pbVar15 + size <= pbVar24) {
    __assert_fail("s < result + result_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x215a,
                  "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                 );
  }
  *pbVar24 = 0;
LAB_003697c2:
  pxVar11 = xpath_string::from_heap_preallocated
                      (__return_storage_ptr__,(char_t *)pbVar15,(char_t *)pbVar24);
  return pxVar11;
}

Assistant:

xpath_string eval_string(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_string_constant:
				return xpath_string::from_const(_data.string);

			case ast_func_local_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_local_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_namespace_uri_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_namespace_uri_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_string_0:
				return string_value(c.n, stack.result);

			case ast_func_string_1:
				return _left->eval_string(c, stack);

			case ast_func_concat:
				return eval_string_concat(c, stack);

			case ast_func_substring_before:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());

				return pos ? xpath_string::from_heap(s.c_str(), pos, stack.result) : xpath_string();
			}

			case ast_func_substring_after:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());
				if (!pos) return xpath_string();

				const char_t* rbegin = pos + p.length();
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_2:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));

				if (is_nan(first)) return xpath_string(); // NaN
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				assert(1 <= pos && pos <= s_length + 1);

				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_3:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));
				double last = first + round_nearest(_right->_next->eval_number(c, stack));

				if (is_nan(first) || is_nan(last)) return xpath_string();
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();
				else if (first >= last) return xpath_string();
				else if (last < 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				size_t end = last >= static_cast<double>(s_length + 1) ? s_length + 1 : static_cast<size_t>(last);

				assert(1 <= pos && pos <= end && end <= s_length + 1);
				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + (end - 1);

				return (end == s_length + 1 && !s.uses_heap()) ? xpath_string::from_const(rbegin) : xpath_string::from_heap(rbegin, rend, stack.result);
			}

			case ast_func_normalize_space_0:
			{
				xpath_string s = string_value(c.n, stack.result);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_normalize_space_1:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_translate:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, stack);
				xpath_string from = _right->eval_string(c, swapped_stack);
				xpath_string to = _right->_next->eval_string(c, swapped_stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate(begin, from.c_str(), to.c_str(), to.length());

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_opt_translate_table:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate_table(begin, _data.table);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_string)
					return xpath_string::from_const(_data.variable->get_string());

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_boolean:
				return xpath_string::from_const(eval_boolean(c, stack) ? PUGIXML_TEXT("true") : PUGIXML_TEXT("false"));

			case xpath_type_number:
				return convert_number_to_string(eval_number(c, stack), stack.result);

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ns = eval_node_set(c, swapped_stack, nodeset_eval_first);
				return ns.empty() ? xpath_string() : string_value(ns.first(), stack.result);
			}

			default:
				assert(false && "Wrong expression for return type string"); // unreachable
				return xpath_string();
			}
		}